

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_eigensolver_sac.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  EigensolverSacProblem *this_00;
  ostream *poVar1;
  long *plVar2;
  ulong uVar3;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  timeval tVar7;
  timeval tVar8;
  shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem> eigenproblem_ptr;
  bearingVectors_t bearingVectors2;
  bearingVectors_t bearingVectors1;
  vector<int,_std::allocator<int>_> camCorrespondences2;
  vector<int,_std::allocator<int>_> camCorrespondences1;
  timeval tic;
  MatrixXd gt;
  rotations_t camRotations;
  translations_t camOffsets;
  translation_t position1;
  timeval toc;
  translation_t position2;
  rotation_t rotation1;
  translation_t position;
  undefined1 local_308 [224];
  pointer local_228;
  pointer piStack_220;
  pointer piStack_218;
  pointer piStack_210;
  pointer piStack_208;
  pointer piStack_200;
  element_type *peStack_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f0;
  rotation_t rotation;
  rotation_t rotation2;
  CentralRelativeAdapter adapter;
  model_t optimizedModel;
  
  opengv::initializeRandomSeed();
  position1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  position1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  position1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  opengv::generateRandomDirectionTranslation(&position2,0.1);
  opengv::generateRandomRotation(&rotation2,0.5);
  camOffsets.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  camOffsets.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  camOffsets.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  camRotations.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  camRotations.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  camRotations.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateCentralCameraSystem(&camOffsets,&camRotations);
  bearingVectors1.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bearingVectors1.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bearingVectors1.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bearingVectors2.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bearingVectors2.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bearingVectors2.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  gt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  gt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  gt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&gt,300,3,100);
  opengv::generateRandom2D2DCorrespondences
            (&position1,&rotation1,&position2,&rotation2,&camOffsets,&camRotations,100,0.5,0.1,
             &bearingVectors1,&bearingVectors2,&camCorrespondences1,&camCorrespondences2,&gt);
  opengv::extractRelativePose(&position1,&position2,&rotation1,&rotation2,&position,&rotation,true);
  opengv::printExperimentCharacteristics(&position,&rotation,0.5,0.1);
  opengv::relative_pose::CentralRelativeAdapter::CentralRelativeAdapter
            (&adapter,&bearingVectors1,&bearingVectors2,&rotation);
  local_308._8_4_ = 1000;
  local_308._16_8_ = 1.0;
  local_308._24_8_ = 0.99;
  local_228 = (pointer)0x0;
  piStack_220 = (pointer)0x0;
  piStack_218 = (pointer)0x0;
  piStack_210 = (pointer)0x0;
  piStack_208 = (pointer)0x0;
  piStack_200 = (pointer)0x0;
  peStack_1f8 = (element_type *)0x0;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_308._0_8_ = &PTR__SampleConsensus_0026fa10;
  this_00 = (EigensolverSacProblem *)operator_new(0x13f0);
  opengv::sac_problems::relative_pose::EigensolverSacProblem::EigensolverSacProblem
            (this_00,&adapter.super_RelativeAdapterBase,10,true);
  this = &eigenproblem_ptr.
          super___shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  eigenproblem_ptr.
  super___shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<opengv::sac_problems::relative_pose::EigensolverSacProblem*>(this,this_00);
  peStack_1f8 = eigenproblem_ptr.
                super___shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_1f0,this);
  local_308._16_8_ = 1.0;
  local_308._8_4_ = 100;
  gettimeofday((timeval *)&tic,(__timezone_ptr_t)0x0);
  opengv::sac::Ransac<opengv::sac_problems::relative_pose::EigensolverSacProblem>::computeModel
            ((Ransac<opengv::sac_problems::relative_pose::EigensolverSacProblem> *)local_308,0);
  gettimeofday((timeval *)&toc,(__timezone_ptr_t)0x0);
  tVar7 = timeval_minus(&toc,&tic);
  tVar8 = timeval_minus(&toc,&tic);
  (*((eigenproblem_ptr.
      super___shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_SampleConsensusProblem<opengv::EigensolverOutput>)._vptr_SampleConsensusProblem
    [6])(eigenproblem_ptr.
         super___shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr,&piStack_210,local_308 + 0x20,&optimizedModel);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the ransac results is: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)(local_308 + 0x38))
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ransac needed ",0xe);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_308._12_4_);
  uVar5 = extraout_XMM0_Qb;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," iterations and ",0x10);
  auVar6._0_8_ = (double)tVar7.tv_sec;
  auVar6._8_8_ = uVar5;
  auVar4._0_8_ = (double)tVar8.tv_usec;
  auVar4._8_8_ = uVar5;
  auVar4 = vfmadd132sd_fma(auVar4,auVar6,ZEXT816(0x3eb0c6f7a0b5ed8d));
  poVar1 = std::ostream::_M_insert<double>(auVar4._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," seconds",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the number of inliers is: ",0x1a);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the found inliers are: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if (piStack_208 != piStack_210) {
    uVar3 = 0;
    do {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piStack_210[uVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)piStack_208 - (long)piStack_210 >> 2));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the optimized result is: ",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                             &optimizedModel.rotation);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (eigenproblem_ptr.
      super___shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (eigenproblem_ptr.
               super___shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  opengv::sac::SampleConsensus<opengv::sac_problems::relative_pose::EigensolverSacProblem>::
  ~SampleConsensus((SampleConsensus<opengv::sac_problems::relative_pose::EigensolverSacProblem> *)
                   local_308);
  opengv::relative_pose::CentralRelativeAdapter::~CentralRelativeAdapter(&adapter);
  if (gt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)gt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_data[-1]);
  }
  if (camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (bearingVectors2.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)bearingVectors2.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  if (bearingVectors1.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)bearingVectors1.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  if (camRotations.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)camRotations.
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [8]);
  }
  if (camOffsets.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)camOffsets.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  // initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.5;
  double outlierFraction = 0.1;
  size_t numberPoints = 100;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomDirectionTranslation(0.1);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateCentralCameraSystem( camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors1;
  bearingVectors_t bearingVectors2;
  std::vector<int> camCorrespondences1; //unused in the central case
  std::vector<int> camCorrespondences2; //unused in the central case
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D2DCorrespondences(
      position1, rotation1, position2, rotation2,
      camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors1, bearingVectors2,
      camCorrespondences1, camCorrespondences2, gt );

  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );

  //create a central relative adapter
  relative_pose::CentralRelativeAdapter adapter(
      bearingVectors1,
      bearingVectors2,
      rotation);

  //Create an EigensolverSacProblem and Ransac
  //The number of samples can be configured
  sac::Ransac<
      sac_problems::relative_pose::EigensolverSacProblem> ransac;
  std::shared_ptr<
      sac_problems::relative_pose::EigensolverSacProblem> eigenproblem_ptr(
      new sac_problems::relative_pose::EigensolverSacProblem(adapter,10));
  ransac.sac_model_ = eigenproblem_ptr;
  ransac.threshold_ = 1.0;
  ransac.max_iterations_ = 100;

  //Run the experiment
  struct timeval tic;
  struct timeval toc;
  gettimeofday( &tic, 0 );
  ransac.computeModel();
  gettimeofday( &toc, 0 );
  double ransac_time = TIMETODOUBLE(timeval_minus(toc,tic));

  //do final polishing of the model over all inliers
  sac_problems::relative_pose::EigensolverSacProblem::model_t optimizedModel;
  eigenproblem_ptr->optimizeModelCoefficients(
      ransac.inliers_,
      ransac.model_coefficients_,
      optimizedModel);

  //print the results
  std::cout << "the ransac results is: " << std::endl;
  std::cout << ransac.model_coefficients_.rotation << std::endl << std::endl;
  std::cout << "Ransac needed " << ransac.iterations_ << " iterations and ";
  std::cout << ransac_time << " seconds" << std::endl << std::endl;
  std::cout << "the number of inliers is: " << ransac.inliers_.size();
  std::cout << std::endl << std::endl;
  std::cout << "the found inliers are: " << std::endl;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
    std::cout << ransac.inliers_[i] << " ";
  std::cout << std::endl << std::endl;
  std::cout << "the optimized result is: " << std::endl;
  std::cout << optimizedModel.rotation << std::endl;
}